

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

adaptive_arith_data_model * __thiscall
lzham::adaptive_arith_data_model::operator=
          (adaptive_arith_data_model *this,adaptive_arith_data_model *rhs)

{
  adaptive_bit_model_vector *this_00;
  uint uVar1;
  adaptive_bit_model *paVar2;
  adaptive_bit_model *paVar3;
  bool bVar4;
  long lVar5;
  
  this->m_total_syms = rhs->m_total_syms;
  if (this != rhs) {
    this_00 = &this->m_probs;
    if ((this->m_probs).m_capacity < (rhs->m_probs).m_size) {
      if (this_00->m_p != (adaptive_bit_model *)0x0) {
        lzham_free(this_00->m_p);
        this_00->m_p = (adaptive_bit_model *)0x0;
        (this->m_probs).m_size = 0;
        (this->m_probs).m_capacity = 0;
      }
      bVar4 = elemental_vector::increase_capacity
                        ((elemental_vector *)this_00,(rhs->m_probs).m_size,false,2,
                         vector<lzham::adaptive_bit_model>::object_mover,false);
      if (!bVar4) {
        lzham_fail("\"lzham::vector operator=: Out of memory!\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/decomp/lzham_vector.h"
                   ,0x60);
        return this;
      }
    }
    else if ((this->m_probs).m_size != 0) {
      (this->m_probs).m_size = 0;
    }
    uVar1 = (rhs->m_probs).m_size;
    if (uVar1 != 0) {
      paVar2 = (rhs->m_probs).m_p;
      paVar3 = this_00->m_p;
      lVar5 = 0;
      do {
        paVar3[lVar5].m_bit_0_prob = paVar2[lVar5].m_bit_0_prob;
        lVar5 = lVar5 + 1;
      } while (uVar1 != (uint)lVar5);
    }
    (this->m_probs).m_size = uVar1;
  }
  return this;
}

Assistant:

adaptive_arith_data_model& adaptive_arith_data_model::operator= (const adaptive_arith_data_model& rhs)
   {
      m_total_syms = rhs.m_total_syms;
      m_probs = rhs.m_probs;
      return *this;
   }